

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_printf(roaring_bitmap_t *r)

{
  int local_1c;
  int i;
  roaring_array_t *ra;
  roaring_bitmap_t *r_local;
  
  printf("{");
  for (local_1c = 0; local_1c < (r->high_low_container).size; local_1c = local_1c + 1) {
    container_printf_as_uint32_array
              ((r->high_low_container).containers[local_1c],
               (r->high_low_container).typecodes[local_1c],
               (uint)(r->high_low_container).keys[local_1c] << 0x10);
    if (local_1c + 1 < (r->high_low_container).size) {
      printf(",");
    }
  }
  printf("}");
  return;
}

Assistant:

void roaring_bitmap_printf(const roaring_bitmap_t *r) {
    const roaring_array_t *ra = &r->high_low_container;

    printf("{");
    for (int i = 0; i < ra->size; ++i) {
        container_printf_as_uint32_array(ra->containers[i], ra->typecodes[i],
                                         ((uint32_t)ra->keys[i]) << 16);

        if (i + 1 < ra->size) {
            printf(",");
        }
    }
    printf("}");
}